

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_compress.c
# Opt level: O1

TIFFCodec * TIFFGetConfiguredCODECs(void)

{
  TIFFCodec *pTVar1;
  int iVar2;
  void *p;
  void *p_00;
  _codec *p_Var3;
  void *p_01;
  int iVar4;
  long lVar5;
  TIFFCodec *pTVar6;
  
  iVar4 = 1;
  if (registeredCODECS == (codec_t *)0x0) {
    p = (void *)0x0;
  }
  else {
    p_Var3 = registeredCODECS;
    p_01 = (void *)0x0;
    lVar5 = 0;
    do {
      p = _TIFFreallocExt((TIFF *)0x0,p_01,lVar5 + 0x18);
      if (p == (void *)0x0) goto LAB_0028f161;
      _TIFFmemcpy((void *)(lVar5 + (long)p),p_Var3->info,0x18);
      p_Var3 = p_Var3->next;
      iVar4 = iVar4 + 1;
      p_01 = p;
      lVar5 = lVar5 + 0x18;
    } while (p_Var3 != (_codec *)0x0);
  }
  pTVar6 = _TIFFBuiltinCODECS;
  do {
    iVar2 = TIFFIsCODECConfigured(pTVar6->scheme);
    p_00 = p;
    if (iVar2 != 0) {
      p_00 = _TIFFreallocExt((TIFF *)0x0,p,(long)iVar4 * 0x18);
      p_01 = p;
      if (p_00 == (void *)0x0) goto LAB_0028f161;
      _TIFFmemcpy((void *)((long)p_00 + (long)iVar4 * 0x18 + -0x18),pTVar6,0x18);
      iVar4 = iVar4 + 1;
    }
    pTVar1 = pTVar6 + 1;
    pTVar6 = pTVar6 + 1;
    p = p_00;
  } while (pTVar1->name != (char *)0x0);
  pTVar6 = (TIFFCodec *)_TIFFreallocExt((TIFF *)0x0,p_00,(long)iVar4 * 0x18);
  p_01 = p_00;
  if (pTVar6 == (TIFFCodec *)0x0) {
LAB_0028f161:
    pTVar6 = (TIFFCodec *)0x0;
    _TIFFfreeExt((TIFF *)0x0,p_01);
  }
  else {
    _TIFFmemset(pTVar6 + (long)iVar4 + -1,0,0x18);
  }
  return pTVar6;
}

Assistant:

TIFFCodec *TIFFGetConfiguredCODECs()
{
    int i = 1;
    codec_t *cd;
    const TIFFCodec *c;
    TIFFCodec *codecs = NULL;
    TIFFCodec *new_codecs;

    for (cd = registeredCODECS; cd; cd = cd->next)
    {
        new_codecs =
            (TIFFCodec *)_TIFFreallocExt(NULL, codecs, i * sizeof(TIFFCodec));
        if (!new_codecs)
        {
            _TIFFfreeExt(NULL, codecs);
            return NULL;
        }
        codecs = new_codecs;
        _TIFFmemcpy(codecs + i - 1, cd->info, sizeof(TIFFCodec));
        i++;
    }
    for (c = _TIFFBuiltinCODECS; c->name; c++)
    {
        if (TIFFIsCODECConfigured(c->scheme))
        {
            new_codecs = (TIFFCodec *)_TIFFreallocExt(NULL, codecs,
                                                      i * sizeof(TIFFCodec));
            if (!new_codecs)
            {
                _TIFFfreeExt(NULL, codecs);
                return NULL;
            }
            codecs = new_codecs;
            _TIFFmemcpy(codecs + i - 1, (const void *)c, sizeof(TIFFCodec));
            i++;
        }
    }

    new_codecs =
        (TIFFCodec *)_TIFFreallocExt(NULL, codecs, i * sizeof(TIFFCodec));
    if (!new_codecs)
    {
        _TIFFfreeExt(NULL, codecs);
        return NULL;
    }
    codecs = new_codecs;
    _TIFFmemset(codecs + i - 1, 0, sizeof(TIFFCodec));

    return codecs;
}